

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

void __thiscall CLOptions::DefineParams(CLOptions *this)

{
  vector<option,_std::allocator<option>_> *pvVar1;
  string *psVar2;
  char cVar3;
  pointer poVar4;
  int iVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
  *pmVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
  *pmVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
  *pmVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_type sVar13;
  bool bVar14;
  pointer pcVar15;
  undefined8 uVar16;
  _Base_ptr p_Var17;
  ulong uVar18;
  allocator_type local_59;
  CLOptions *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pvVar1 = &this->longopts;
  poVar4 = (this->longopts).super__Vector_base<option,_std::allocator<option>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->longopts).super__Vector_base<option,_std::allocator<option>_>._M_impl.
      super__Vector_impl_data._M_finish != poVar4) {
    (this->longopts).super__Vector_base<option,_std::allocator<option>_>._M_impl.
    super__Vector_impl_data._M_finish = poVar4;
  }
  sVar9 = (this->params_doubles)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  sVar10 = (this->params_bools)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  sVar11 = (this->params_ints)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  sVar12 = (this->params_strings)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  psVar2 = &(this->version_opt).
            super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .parameter_name;
  std::__cxx11::string::string((string *)&local_50,(string *)psVar2);
  sVar13 = local_50._M_string_length;
  std::__cxx11::string::~string((string *)&local_50);
  std::vector<option,_std::allocator<option>_>::vector
            ((vector<option,_std::allocator<option>_> *)&local_50,
             (long)(int)((3 - (uint)(sVar13 == 0)) +
                        (int)sVar9 + (int)sVar10 + (int)sVar11 + (int)sVar12),&local_59);
  std::vector<option,_std::allocator<option>_>::_M_move_assign(pvVar1,&local_50);
  std::_Vector_base<option,_std::allocator<option>_>::~_Vector_base
            ((_Vector_base<option,_std::allocator<option>_> *)&local_50);
  bVar14 = std::operator!=(&this->help_str,"");
  if (bVar14) {
    pcVar15 = (this->help_str)._M_dataplus._M_p;
  }
  else {
    pcVar15 = (pointer)0x0;
  }
  poVar4 = (this->longopts).super__Vector_base<option,_std::allocator<option>_>._M_impl.
           super__Vector_impl_data._M_start;
  poVar4->name = pcVar15;
  poVar4->has_arg = 0;
  poVar4->flag = (int *)0x0;
  poVar4->val = 0x68;
  std::__cxx11::string::string((string *)&local_50,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_50);
  if (local_50._M_string_length == 0) {
    iVar5 = 1;
  }
  else {
    bVar14 = std::operator!=(&this->version_str,"");
    if (bVar14) {
      pcVar15 = (this->version_str)._M_dataplus._M_p;
    }
    else {
      pcVar15 = (pointer)0x0;
    }
    poVar4 = (this->longopts).super__Vector_base<option,_std::allocator<option>_>._M_impl.
             super__Vector_impl_data._M_start;
    poVar4[1].name = pcVar15;
    poVar4[1].has_arg = 0;
    poVar4[1].flag = (int *)0x0;
    poVar4[1].val = 0x76;
    iVar5 = 2;
  }
  p_Var17 = (this->params_bools)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  uVar18 = (ulong)(uint)(iVar5 << 5) | 0x18;
  local_58 = this;
  while ((_Rb_tree_header *)p_Var17 != &(this->params_bools)._M_t._M_impl.super__Rb_tree_header) {
    cVar3 = *(char *)(*(long *)(p_Var17 + 2) + 0x28);
    bVar14 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var17 + 1),"");
    if (bVar14) {
      uVar16 = *(undefined8 *)(p_Var17 + 1);
    }
    else {
      uVar16 = 0;
    }
    poVar4 = (pvVar1->super__Vector_base<option,_std::allocator<option>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(undefined8 *)((long)poVar4 + (uVar18 - 0x18)) = uVar16;
    *(undefined4 *)((long)poVar4 + (uVar18 - 0x10)) = 1;
    *(undefined8 *)((long)poVar4 + (uVar18 - 8)) = 0;
    *(int *)((long)&poVar4->name + uVar18) = (int)cVar3;
    p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
    uVar18 = uVar18 + 0x20;
  }
  p_Var17 = (local_58->params_doubles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar6 = &local_58->params_doubles;
  while ((_Rb_tree_header *)p_Var17 != &(pmVar6->_M_t)._M_impl.super__Rb_tree_header) {
    cVar3 = *(char *)(*(long *)(p_Var17 + 2) + 0x28);
    bVar14 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var17 + 1),"");
    if (bVar14) {
      uVar16 = *(undefined8 *)(p_Var17 + 1);
    }
    else {
      uVar16 = 0;
    }
    poVar4 = (pvVar1->super__Vector_base<option,_std::allocator<option>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(undefined8 *)((long)poVar4 + (uVar18 - 0x18)) = uVar16;
    *(undefined4 *)((long)poVar4 + (uVar18 - 0x10)) = 1;
    *(undefined8 *)((long)poVar4 + (uVar18 - 8)) = 0;
    *(int *)((long)&poVar4->name + uVar18) = (int)cVar3;
    p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
    uVar18 = uVar18 + 0x20;
  }
  p_Var17 = (local_58->params_ints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar7 = &local_58->params_ints;
  while ((_Rb_tree_header *)p_Var17 != &(pmVar7->_M_t)._M_impl.super__Rb_tree_header) {
    cVar3 = *(char *)(*(long *)(p_Var17 + 2) + 0x28);
    bVar14 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var17 + 1),"");
    if (bVar14) {
      uVar16 = *(undefined8 *)(p_Var17 + 1);
    }
    else {
      uVar16 = 0;
    }
    poVar4 = (pvVar1->super__Vector_base<option,_std::allocator<option>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(undefined8 *)((long)poVar4 + (uVar18 - 0x18)) = uVar16;
    *(undefined4 *)((long)poVar4 + (uVar18 - 0x10)) = 1;
    *(undefined8 *)((long)poVar4 + (uVar18 - 8)) = 0;
    *(int *)((long)&poVar4->name + uVar18) = (int)cVar3;
    p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
    uVar18 = uVar18 + 0x20;
  }
  p_Var17 = (local_58->params_strings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar8 = &local_58->params_strings;
  while ((_Rb_tree_header *)p_Var17 != &(pmVar8->_M_t)._M_impl.super__Rb_tree_header) {
    cVar3 = *(char *)(*(long *)(p_Var17 + 2) + 0x28);
    bVar14 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var17 + 1),"");
    if (bVar14) {
      uVar16 = *(undefined8 *)(p_Var17 + 1);
    }
    else {
      uVar16 = 0;
    }
    poVar4 = (pvVar1->super__Vector_base<option,_std::allocator<option>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(undefined8 *)((long)poVar4 + (uVar18 - 0x18)) = uVar16;
    *(undefined4 *)((long)poVar4 + (uVar18 - 0x10)) = 1;
    *(undefined8 *)((long)poVar4 + (uVar18 - 8)) = 0;
    *(int *)((long)&poVar4->name + uVar18) = (int)cVar3;
    p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
    uVar18 = uVar18 + 0x20;
  }
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_59);
  bVar14 = std::operator!=(&local_50,"");
  if (!bVar14) {
    local_50._M_dataplus._M_p = (char *)0x0;
  }
  poVar4 = (local_58->longopts).super__Vector_base<option,_std::allocator<option>_>._M_impl.
           super__Vector_impl_data._M_finish;
  poVar4[-1].name = local_50._M_dataplus._M_p;
  poVar4[-1].has_arg = 0;
  poVar4[-1].flag = (int *)0x0;
  poVar4[-1].val = 0;
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void CLOptions::DefineParams()
{
    // Clear out the longopts object
    longopts.clear() ;
    
    // Resize it to hold exactly the number of variables we need
    int options_count = params_bools.size() +
                        params_doubles.size() +
                        params_ints.size() +
                        params_strings.size() + 2 ;
    if (!version_opt.getParamName().empty()) options_count++ ;
    
    longopts = std::vector<struct option>(options_count) ;
    int opt_num(0) ;
    
    // Add the help option
    longopts[opt_num++] = DefineOptSingle(help_str, no_argument, 0, 'h') ;
    
    // Add the version information if so requested
    if (!version_opt.getParamName().empty()) {
        longopts[opt_num++] = DefineOptSingle(version_str, no_argument, 0, 'v') ;
    }
    
    // Add the bool options
    std::map<std::string, CLBool*>::iterator biter ;
    for (biter=params_bools.begin(); biter!=params_bools.end(); ++biter) {
        longopts[opt_num++] = DefineOptSingle(biter->first, required_argument, 0,
                                              biter->second->getShortParamName()) ;
    }
    
    // Add the double options
    std::map<std::string, CLDouble*>::iterator diter ;
    for (diter=params_doubles.begin(); diter!=params_doubles.end(); ++diter) {
        longopts[opt_num++] = DefineOptSingle(diter->first, required_argument, 0, 
                                              diter->second->getShortParamName()) ;
    }
    
    // Add the int options
    std::map<std::string, CLInt*>::iterator iiter ;
    for (iiter=params_ints.begin(); iiter!=params_ints.end(); ++iiter) {
        longopts[opt_num++] = DefineOptSingle(iiter->first, required_argument, 0, 
                                              iiter->second->getShortParamName()) ;
    }
    
    // Add the string options
    std::map<std::string, CLString*>::iterator siter ;
    for (siter=params_strings.begin(); siter!=params_strings.end(); ++siter) {
        longopts[opt_num++] = DefineOptSingle(siter->first, required_argument, 0, 
                                              siter->second->getShortParamName()) ;
    }
    
    // Add the terminating options
    longopts.back() = DefineOptSingle("",0,0,0) ;
}